

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Tags::ExpandTagsArray(Tags *this)

{
  Tag *pTVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Tag *this_00;
  int *in_RDI;
  ulong uVar6;
  Tag *dst;
  Tag *src;
  int idx;
  Tag *tags;
  int size;
  Tag *local_b0;
  Tag *local_88;
  int local_7c;
  int local_60;
  bool local_1;
  
  if (in_RDI[1] < *in_RDI) {
    local_1 = true;
  }
  else {
    if (*in_RDI == 0) {
      local_7c = 1;
    }
    else {
      local_7c = *in_RDI << 1;
    }
    uVar3 = (ulong)local_7c;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_88 = (Tag *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_88 = (Tag *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_b0 = local_88;
        do {
          Tag::Tag(local_b0);
          local_b0 = local_b0 + 1;
        } while (local_b0 != local_88 + uVar3);
      }
    }
    if (local_88 == (Tag *)0x0) {
      local_1 = false;
    }
    else {
      for (local_60 = 0; local_60 < in_RDI[1]; local_60 = local_60 + 1) {
        Tag::ShallowCopy((Tag *)(*(long *)(in_RDI + 2) + (long)local_60 * 0x10),local_88 + local_60)
        ;
      }
      pTVar1 = *(Tag **)(in_RDI + 2);
      if (pTVar1 != (Tag *)0x0) {
        this_00 = pTVar1 + *(long *)&pTVar1[-1].simple_tags_size_;
        while (pTVar1 != this_00) {
          this_00 = this_00 + -1;
          Tag::~Tag(this_00);
        }
        operator_delete__(&pTVar1[-1].simple_tags_size_);
      }
      *(Tag **)(in_RDI + 2) = local_88;
      *in_RDI = local_7c;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (tags_size_ > tags_count_)
    return true;  // nothing to do yet

  const int size = (tags_size_ == 0) ? 1 : 2 * tags_size_;

  Tag* const tags = new (std::nothrow) Tag[size];  // NOLINT
  if (tags == NULL)
    return false;

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& src = tags_[idx];
    Tag* const dst = tags + idx;
    src.ShallowCopy(dst);
  }

  delete[] tags_;

  tags_ = tags;
  tags_size_ = size;

  return true;
}